

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

Stream * rw::wdgl::readNativeSkin(Stream *stream,int32 param_2,void *object,int32 offset)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  Skin *this;
  char *pcVar4;
  FILE *__stream;
  Error _e;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    uVar2 = Stream::readU32(stream);
    if (uVar2 == 2) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 564"
      ;
      this = (Skin *)(*DAT_00144da8)(0x70,0x30116);
      *(Skin **)((long)object + (long)offset) = this;
      uVar3 = Stream::readI32(stream);
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)uVar3);
      Stream::read32(stream,this->inverseMatrices,this->numBones << 6);
      return stream;
    }
    _e.plugin = 2;
    _e.code = 0x80000006;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp",0x231);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000006,(ulong)uVar2);
  }
  else {
    _e.plugin = 2;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp",0x22c);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
  }
  fprintf(__stream,"%s\n",pcVar4);
  setError(&_e);
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeSkin(Stream *stream, int32, void *object, int32 offset)
{
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_GL){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	int32 numBones = stream->readI32();
	skin->init(numBones, 0, 0);
	stream->read32(skin->inverseMatrices, skin->numBones*64);
	return stream;
}